

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_stdio.c
# Opt level: O0

size_t file_stdio_fwrite(ALLEGRO_FILE *f,void *ptr,size_t size)

{
  USERDATA *pUVar1;
  size_t sVar2;
  int *piVar3;
  ulong in_RDX;
  void *in_RSI;
  size_t ret;
  USERDATA *userdata;
  ALLEGRO_FILE *in_stack_ffffffffffffffd8;
  
  pUVar1 = get_userdata(in_stack_ffffffffffffffd8);
  sVar2 = fwrite(in_RSI,1,in_RDX,(FILE *)pUVar1->fp);
  if (sVar2 < in_RDX) {
    piVar3 = __errno_location();
    pUVar1->errnum = *piVar3;
    __errno_location();
    al_set_errno((int)((ulong)pUVar1 >> 0x20));
  }
  return sVar2;
}

Assistant:

static size_t file_stdio_fwrite(ALLEGRO_FILE *f, const void *ptr, size_t size)
{
   USERDATA *userdata = get_userdata(f);
   size_t ret;

   ret = fwrite(ptr, 1, size, userdata->fp);
   if (ret < size) {
      userdata->errnum = errno;
      al_set_errno(errno);
   }

   return ret;
}